

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arm.cpp
# Opt level: O3

void __thiscall arm::LoadStoreInst::display(LoadStoreInst *this,ostream *o)

{
  __index_type _Var1;
  
  display_op((this->super_Inst).op,o);
  display_cond((this->super_Inst).cond,o);
  std::__ostream_insert<char,std::char_traits<char>>(o," ",1);
  display_reg_name(o,this->rd);
  std::__ostream_insert<char,std::char_traits<char>>(o,", ",2);
  _Var1 = *(__index_type *)
           ((long)&(this->mem).
                   super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::MemoryOperand>
                   .super__Move_assign_alias<std::__cxx11::basic_string<char>,_arm::MemoryOperand>.
                   super__Copy_assign_alias<std::__cxx11::basic_string<char>,_arm::MemoryOperand>.
                   super__Move_ctor_alias<std::__cxx11::basic_string<char>,_arm::MemoryOperand>.
                   super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_arm::MemoryOperand>.
                   super__Variant_storage_alias<std::__cxx11::basic_string<char>,_arm::MemoryOperand>
           + 0x30);
  if (_Var1 == '\x01') {
    (*(code *)**(undefined8 **)
                &(this->mem).
                 super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::MemoryOperand>
                 .super__Move_assign_alias<std::__cxx11::basic_string<char>,_arm::MemoryOperand>.
                 super__Copy_assign_alias<std::__cxx11::basic_string<char>,_arm::MemoryOperand>.
                 super__Move_ctor_alias<std::__cxx11::basic_string<char>,_arm::MemoryOperand>.
                 super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_arm::MemoryOperand>.
                 super__Variant_storage_alias<std::__cxx11::basic_string<char>,_arm::MemoryOperand>.
                 _M_u)(&this->mem,o);
    return;
  }
  if (_Var1 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              (o,*(char **)&(this->mem).
                            super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::MemoryOperand>
                            .
                            super__Move_assign_alias<std::__cxx11::basic_string<char>,_arm::MemoryOperand>
                            .
                            super__Copy_assign_alias<std::__cxx11::basic_string<char>,_arm::MemoryOperand>
                            .
                            super__Move_ctor_alias<std::__cxx11::basic_string<char>,_arm::MemoryOperand>
                            .
                            super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_arm::MemoryOperand>
                            .
                            super__Variant_storage_alias<std::__cxx11::basic_string<char>,_arm::MemoryOperand>
                            ._M_u,
               *(long *)((long)&(this->mem).
                                super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::MemoryOperand>
                                .
                                super__Move_assign_alias<std::__cxx11::basic_string<char>,_arm::MemoryOperand>
                                .
                                super__Copy_assign_alias<std::__cxx11::basic_string<char>,_arm::MemoryOperand>
                                .
                                super__Move_ctor_alias<std::__cxx11::basic_string<char>,_arm::MemoryOperand>
                                .
                                super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_arm::MemoryOperand>
                                .
                                super__Variant_storage_alias<std::__cxx11::basic_string<char>,_arm::MemoryOperand>
                        + 8));
    return;
  }
  return;
}

Assistant:

void LoadStoreInst::display(std::ostream &o) const {
  display_op(op, o);
  display_cond(cond, o);
  o << " ";
  display_reg_name(o, rd);
  o << ", ";
  if (auto m = std::get_if<std::string>(&mem)) {
    o << *m;
  } else if (auto m = std::get_if<MemoryOperand>(&mem)) {
    o << *m;
  }
}